

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O1

void __thiscall
tchecker::clock_updates_visitor_t::visit(clock_updates_visitor_t *this,typed_if_statement_t *stmt)

{
  typed_statement_t *ptVar1;
  clock_updates_visitor_t v;
  undefined **local_50;
  clock_updates_map_t local_48;
  size_t local_30;
  
  local_50 = &PTR__clock_updates_visitor_t_001e55d8;
  std::vector<tchecker::clock_updates_list_t,_std::allocator<tchecker::clock_updates_list_t>_>::
  vector(&local_48._map,&(this->_u)._map);
  local_30 = this->_loop_depth;
  ptVar1 = typed_if_statement_t::then_stmt(stmt);
  (**(code **)(*(long *)ptVar1 + 0x30))(ptVar1,this);
  ptVar1 = typed_if_statement_t::else_stmt(stmt);
  (**(code **)(*(long *)ptVar1 + 0x30))(ptVar1,&local_50);
  clock_updates_map_t::absorbing_merge(&this->_u,&local_48);
  local_50 = &PTR__clock_updates_visitor_t_001e55d8;
  std::vector<tchecker::clock_updates_list_t,_std::allocator<tchecker::clock_updates_list_t>_>::
  ~vector(&local_48._map);
  return;
}

Assistant:

virtual void visit(tchecker::typed_if_statement_t const & stmt)
  {
    tchecker::clock_updates_visitor_t v(*this);
    stmt.then_stmt().visit(*this);
    stmt.else_stmt().visit(v);
    _u.absorbing_merge(v._u);
  }